

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
::find<google::protobuf::FieldDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
           *this,key_arg<const_google::protobuf::FieldDescriptor_*> *key)

{
  uintptr_t v;
  ulong uVar1;
  iterator iVar2;
  
  AssertHashEqConsistent<google::protobuf::FieldDescriptor_const*>(this,key);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
              *)this);
  uVar1 = ((ulong)*key ^ 0x463ad8) * -0x234dd359734ecb13;
  uVar1 = ((uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
  iVar2 = find_non_soo<google::protobuf::FieldDescriptor_const*>
                    (this,key,uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                              (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                              (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                              (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  return iVar2;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }